

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  size_t *psVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar27 [64];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar27._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar27._8_56_ = extraout_var;
  auVar32._8_8_ = 0;
  auVar32._0_4_ = time_range->lower;
  auVar32._4_4_ = time_range->upper;
  auVar23 = auVar27._0_16_;
  auVar24 = vcmpps_avx(auVar23,auVar32,1);
  auVar25 = vblendps_avx(auVar32,auVar23,2);
  auVar23 = vinsertps_avx(auVar23,auVar32,0x50);
  auVar25 = vblendvps_avx(auVar23,auVar25,auVar24);
  auVar24 = vmovshdup_avx(auVar25);
  fVar22 = auVar25._0_4_;
  fVar31 = auVar24._0_4_;
  if (fVar22 <= fVar31) {
    uVar11 = r->_begin;
    local_88 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                lower.field_0.m128;
    local_98 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                upper.field_0.m128;
    local_a8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                lower.field_0.m128;
    local_b8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                upper.field_0.m128;
    local_c0 = __return_storage_ptr__->end;
    if (uVar11 < r->_end) {
      do {
        auVar49._8_4_ = 0x5dccb9a2;
        auVar49._0_8_ = 0x5dccb9a25dccb9a2;
        auVar23._8_4_ = 0xddccb9a2;
        auVar23._0_8_ = 0xddccb9a2ddccb9a2;
        auVar49._12_4_ = 0x5dccb9a2;
        auVar23._12_4_ = 0xddccb9a2;
        BVar3 = (this->super_LineSegments).super_Geometry.time_range;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = BVar3.lower;
        auVar24._4_4_ = BVar3.upper;
        fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar25 = vmovshdup_avx(auVar24);
        auVar25 = vsubps_avx(auVar25,auVar24);
        lVar19 = *(long *)&(this->super_LineSegments).super_Geometry.field_0x58;
        uVar4 = *(uint *)(lVar19 + *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
        pBVar5 = (this->super_LineSegments).vertices.items;
        if ((ulong)(uVar4 + 1) < (pBVar5->super_RawBufferView).num) {
          auVar24 = ZEXT416((uint)(fVar1 * ((fVar31 - BVar3.lower) / auVar25._0_4_) * 0.99999976));
          auVar24 = vroundss_avx(auVar24,auVar24,10);
          auVar24 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
          uVar17 = (uint)auVar24._0_4_;
          auVar25 = ZEXT416((uint)(fVar1 * ((fVar22 - BVar3.lower) / auVar25._0_4_) * 1.0000002));
          auVar25 = vroundss_avx(auVar25,auVar25,9);
          auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,auVar25);
          uVar9 = (uint)auVar25._0_4_;
          bVar6 = uVar17 < uVar9;
          if (uVar9 <= uVar17) {
            uVar15 = (ulong)(int)uVar9;
            pcVar12 = pBVar5[uVar15].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[uVar15].super_RawBufferView.stride;
            auVar25 = *(undefined1 (*) [16])(pcVar12 + sVar18 * uVar4);
            auVar24 = vcmpps_avx(auVar25,auVar23,2);
            auVar32 = vcmpps_avx(auVar25,auVar49,5);
            auVar24 = vorps_avx(auVar24,auVar32);
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar24[0xf]) {
              psVar13 = &pBVar5[uVar15 + 1].super_RawBufferView.stride;
              do {
                auVar24 = *(undefined1 (*) [16])(pcVar12 + sVar18 * (uVar4 + 1));
                auVar32 = vcmpps_avx(auVar24,auVar23,2);
                auVar26 = vcmpps_avx(auVar24,auVar49,5);
                auVar32 = vorps_avx(auVar32,auVar26);
                if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar32[0xf] < '\0') break;
                auVar25 = vshufps_avx(auVar25,auVar25,0xff);
                auVar24 = vshufps_avx(auVar24,auVar24,0xff);
                auVar25 = vminss_avx(auVar25,auVar24);
                if (auVar25._0_4_ < 0.0) break;
                uVar15 = uVar15 + 1;
                bVar6 = (ulong)(long)(int)uVar17 < uVar15;
                if ((ulong)(long)(int)uVar17 < uVar15) break;
                pcVar12 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
                sVar18 = *psVar13;
                psVar13 = psVar13 + 7;
                auVar25 = *(undefined1 (*) [16])(pcVar12 + sVar18 * uVar4);
                auVar24 = vcmpps_avx(auVar25,auVar23,2);
                auVar32 = vcmpps_avx(auVar25,auVar49,5);
                auVar24 = vorps_avx(auVar24,auVar32);
              } while ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar24[0xf]);
            }
          }
        }
        else {
          bVar6 = false;
        }
        auVar33._8_4_ = -INFINITY;
        auVar33._0_8_ = 0xff800000ff800000;
        auVar33._12_4_ = -INFINITY;
        auVar50._8_4_ = INFINITY;
        auVar50._0_8_ = 0x7f8000007f800000;
        auVar50._12_4_ = INFINITY;
        auVar25 = auVar33;
        auVar26 = auVar50;
        if (bVar6) {
          fVar28 = (this->super_LineSegments).super_Geometry.time_range.lower;
          fVar56 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar28;
          fVar57 = (fVar22 - fVar28) / fVar56;
          fVar56 = (fVar31 - fVar28) / fVar56;
          fVar28 = fVar1 * fVar57;
          fVar29 = fVar1 * fVar56;
          auVar23 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),9);
          auVar32 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),10);
          auVar49 = ZEXT816(0) << 0x40;
          auVar25 = vmaxss_avx(auVar23,auVar49);
          auVar24 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
          fVar30 = auVar24._0_4_;
          iVar14 = (int)auVar23._0_4_;
          if (iVar14 < 0) {
            iVar14 = -1;
          }
          uVar4 = (int)fVar1 + 1U;
          if ((int)auVar32._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar4 = (int)auVar32._0_4_;
          }
          lVar10 = (long)(int)auVar25._0_4_;
          uVar9 = *(uint *)(lVar19 + *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
          uVar15 = (ulong)uVar9;
          pBVar5 = (this->super_LineSegments).vertices.items;
          pcVar12 = pBVar5[lVar10].super_RawBufferView.ptr_ofs;
          sVar18 = pBVar5[lVar10].super_RawBufferView.stride;
          lVar20 = sVar18 * uVar15;
          uVar16 = (ulong)(uVar9 + 1);
          lVar19 = sVar18 * uVar16;
          auVar32 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                               *(undefined1 (*) [16])(pcVar12 + lVar19));
          auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                               *(undefined1 (*) [16])(pcVar12 + lVar19));
          fVar2 = (this->super_LineSegments).maxRadiusScale;
          auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                               ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)));
          auVar23 = ZEXT416((uint)(fVar2 * auVar23._0_4_));
          auVar23 = vshufps_avx(auVar23,auVar23,0);
          auVar26 = vsubps_avx(auVar32,auVar23);
          fVar38 = auVar23._0_4_ + auVar24._0_4_;
          fVar39 = auVar23._4_4_ + auVar24._4_4_;
          fVar40 = auVar23._8_4_ + auVar24._8_4_;
          fVar41 = auVar23._12_4_ + auVar24._12_4_;
          lVar19 = (long)(int)fVar30;
          pcVar12 = pBVar5[lVar19].super_RawBufferView.ptr_ofs;
          sVar18 = pBVar5[lVar19].super_RawBufferView.stride;
          lVar21 = sVar18 * uVar15;
          lVar20 = sVar18 * uVar16;
          auVar32 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar21),
                               *(undefined1 (*) [16])(pcVar12 + lVar20));
          auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar21),
                               *(undefined1 (*) [16])(pcVar12 + lVar20));
          auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)),
                               ZEXT416(*(uint *)(pcVar12 + lVar21 + 0xc)));
          auVar23 = ZEXT416((uint)(auVar23._0_4_ * fVar2));
          auVar23 = vshufps_avx(auVar23,auVar23,0);
          auVar32 = vsubps_avx(auVar32,auVar23);
          fVar44 = auVar23._0_4_ + auVar24._0_4_;
          fVar46 = auVar23._4_4_ + auVar24._4_4_;
          fVar47 = auVar23._8_4_ + auVar24._8_4_;
          fVar48 = auVar23._12_4_ + auVar24._12_4_;
          auVar25 = ZEXT416((uint)(fVar28 - auVar25._0_4_));
          fVar34 = auVar26._4_4_;
          fVar35 = auVar26._8_4_;
          fVar36 = auVar26._12_4_;
          fVar28 = auVar26._0_4_;
          fVar52 = auVar32._0_4_;
          fVar53 = auVar32._4_4_;
          fVar54 = auVar32._8_4_;
          fVar55 = auVar32._12_4_;
          if (uVar4 - iVar14 == 1) {
            auVar25 = vmaxss_avx(auVar25,auVar49);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar50._0_4_ = auVar25._0_4_ * fVar28 + fVar52 * auVar24._0_4_;
            auVar50._4_4_ = auVar25._4_4_ * fVar34 + fVar53 * auVar24._4_4_;
            auVar50._8_4_ = auVar25._8_4_ * fVar35 + fVar54 * auVar24._8_4_;
            auVar50._12_4_ = auVar25._12_4_ * fVar36 + fVar55 * auVar24._12_4_;
            auVar33._0_4_ = auVar25._0_4_ * fVar38 + auVar24._0_4_ * fVar44;
            auVar33._4_4_ = auVar25._4_4_ * fVar39 + auVar24._4_4_ * fVar46;
            auVar33._8_4_ = auVar25._8_4_ * fVar40 + auVar24._8_4_ * fVar47;
            auVar33._12_4_ = auVar25._12_4_ * fVar41 + auVar24._12_4_ * fVar48;
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar29)),auVar49);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar23 = vshufps_avx(auVar25,auVar25,0);
            auVar26._0_4_ = auVar24._0_4_ * fVar28 + fVar52 * auVar23._0_4_;
            auVar26._4_4_ = auVar24._4_4_ * fVar34 + fVar53 * auVar23._4_4_;
            auVar26._8_4_ = auVar24._8_4_ * fVar35 + fVar54 * auVar23._8_4_;
            auVar26._12_4_ = auVar24._12_4_ * fVar36 + fVar55 * auVar23._12_4_;
            auVar25._0_4_ = auVar24._0_4_ * fVar38 + auVar23._0_4_ * fVar44;
            auVar25._4_4_ = auVar24._4_4_ * fVar39 + auVar23._4_4_ * fVar46;
            auVar25._8_4_ = auVar24._8_4_ * fVar40 + auVar23._8_4_ * fVar47;
            auVar25._12_4_ = auVar24._12_4_ * fVar41 + auVar23._12_4_ * fVar48;
          }
          else {
            pcVar12 = pBVar5[lVar10 + 1].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[lVar10 + 1].super_RawBufferView.stride;
            lVar20 = sVar18 * uVar15;
            lVar10 = sVar18 * uVar16;
            auVar32 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                                 *(undefined1 (*) [16])(pcVar12 + lVar10));
            auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar12 + lVar20 + 0xc)));
            auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar20),
                                 *(undefined1 (*) [16])(pcVar12 + lVar10));
            auVar23 = ZEXT416((uint)(auVar23._0_4_ * fVar2));
            auVar26 = vshufps_avx(auVar23,auVar23,0);
            auVar33 = vsubps_avx(auVar32,auVar26);
            pcVar12 = pBVar5[lVar19 + -1].super_RawBufferView.ptr_ofs;
            sVar18 = pBVar5[lVar19 + -1].super_RawBufferView.stride;
            lVar10 = sVar18 * uVar15;
            lVar19 = sVar18 * uVar16;
            auVar49 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                 *(undefined1 (*) [16])(pcVar12 + lVar19));
            auVar32 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)));
            auVar23 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                 *(undefined1 (*) [16])(pcVar12 + lVar19));
            auVar32 = ZEXT416((uint)(auVar32._0_4_ * fVar2));
            auVar32 = vshufps_avx(auVar32,auVar32,0);
            auVar42 = vsubps_avx(auVar49,auVar32);
            auVar25 = vmaxss_avx(auVar25,ZEXT816(0) << 0x20);
            auVar49 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar50._0_4_ = auVar33._0_4_ * auVar49._0_4_ + auVar25._0_4_ * fVar28;
            auVar50._4_4_ = auVar33._4_4_ * auVar49._4_4_ + auVar25._4_4_ * fVar34;
            auVar50._8_4_ = auVar33._8_4_ * auVar49._8_4_ + auVar25._8_4_ * fVar35;
            auVar50._12_4_ = auVar33._12_4_ * auVar49._12_4_ + auVar25._12_4_ * fVar36;
            auVar33._0_4_ = auVar25._0_4_ * fVar38 + auVar49._0_4_ * (auVar26._0_4_ + auVar24._0_4_)
            ;
            auVar33._4_4_ = auVar25._4_4_ * fVar39 + auVar49._4_4_ * (auVar26._4_4_ + auVar24._4_4_)
            ;
            auVar33._8_4_ = auVar25._8_4_ * fVar40 + auVar49._8_4_ * (auVar26._8_4_ + auVar24._8_4_)
            ;
            auVar33._12_4_ =
                 auVar25._12_4_ * fVar41 + auVar49._12_4_ * (auVar26._12_4_ + auVar24._12_4_);
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar29)),ZEXT816(0) << 0x20);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar49 = vshufps_avx(auVar25,auVar25,0);
            auVar26._0_4_ = auVar49._0_4_ * fVar52 + auVar24._0_4_ * auVar42._0_4_;
            auVar26._4_4_ = auVar49._4_4_ * fVar53 + auVar24._4_4_ * auVar42._4_4_;
            auVar26._8_4_ = auVar49._8_4_ * fVar54 + auVar24._8_4_ * auVar42._8_4_;
            auVar26._12_4_ = auVar49._12_4_ * fVar55 + auVar24._12_4_ * auVar42._12_4_;
            auVar25._0_4_ = fVar44 * auVar49._0_4_ + (auVar32._0_4_ + auVar23._0_4_) * auVar24._0_4_
            ;
            auVar25._4_4_ = fVar46 * auVar49._4_4_ + (auVar32._4_4_ + auVar23._4_4_) * auVar24._4_4_
            ;
            auVar25._8_4_ = fVar47 * auVar49._8_4_ + (auVar32._8_4_ + auVar23._8_4_) * auVar24._8_4_
            ;
            auVar25._12_4_ =
                 fVar48 * auVar49._12_4_ + (auVar32._12_4_ + auVar23._12_4_) * auVar24._12_4_;
            uVar9 = iVar14 + 1;
            if ((int)uVar9 < (int)uVar4) {
              psVar13 = &pBVar5[uVar9].super_RawBufferView.stride;
              do {
                auVar42._0_4_ = ((float)(int)uVar9 / fVar1 - fVar57) / (fVar56 - fVar57);
                auVar42._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar24 = vshufps_avx(auVar42,auVar42,0);
                fVar28 = auVar26._4_4_;
                fVar29 = auVar26._8_4_;
                fVar30 = auVar26._12_4_;
                auVar23 = vshufps_avx(ZEXT416((uint)(1.0 - auVar42._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar42._0_4_)),0);
                fVar41 = auVar50._4_4_;
                fVar44 = auVar50._8_4_;
                fVar46 = auVar50._12_4_;
                auVar51._0_4_ = auVar26._0_4_ * auVar24._0_4_ + auVar50._0_4_ * auVar23._0_4_;
                auVar51._4_4_ = fVar28 * auVar24._4_4_ + fVar41 * auVar23._4_4_;
                auVar51._8_4_ = fVar29 * auVar24._8_4_ + fVar44 * auVar23._8_4_;
                auVar51._12_4_ = fVar30 * auVar24._12_4_ + fVar46 * auVar23._12_4_;
                fVar38 = auVar25._4_4_;
                fVar39 = auVar25._8_4_;
                fVar40 = auVar25._12_4_;
                fVar34 = auVar33._4_4_;
                fVar35 = auVar33._8_4_;
                fVar36 = auVar33._12_4_;
                auVar43._0_4_ = auVar25._0_4_ * auVar24._0_4_ + auVar33._0_4_ * auVar23._0_4_;
                auVar43._4_4_ = fVar38 * auVar24._4_4_ + fVar34 * auVar23._4_4_;
                auVar43._8_4_ = fVar39 * auVar24._8_4_ + fVar35 * auVar23._8_4_;
                auVar43._12_4_ = fVar40 * auVar24._12_4_ + fVar36 * auVar23._12_4_;
                pcVar12 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
                lVar10 = *psVar13 * uVar15;
                lVar19 = *psVar13 * uVar16;
                auVar32 = vminps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                     *(undefined1 (*) [16])(pcVar12 + lVar19));
                auVar23 = vmaxss_avx(ZEXT416(*(uint *)(pcVar12 + lVar19 + 0xc)),
                                     ZEXT416(*(uint *)(pcVar12 + lVar10 + 0xc)));
                auVar24 = vmaxps_avx(*(undefined1 (*) [16])(pcVar12 + lVar10),
                                     *(undefined1 (*) [16])(pcVar12 + lVar19));
                auVar23 = ZEXT416((uint)(auVar23._0_4_ * fVar2));
                auVar23 = vshufps_avx(auVar23,auVar23,0);
                auVar32 = vsubps_avx(auVar32,auVar23);
                auVar32 = vsubps_avx(auVar32,auVar51);
                auVar45._0_4_ = auVar23._0_4_ + auVar24._0_4_;
                auVar45._4_4_ = auVar23._4_4_ + auVar24._4_4_;
                auVar45._8_4_ = auVar23._8_4_ + auVar24._8_4_;
                auVar45._12_4_ = auVar23._12_4_ + auVar24._12_4_;
                auVar24 = vsubps_avx(auVar45,auVar43);
                auVar23 = vminps_avx(auVar32,ZEXT816(0) << 0x40);
                auVar24 = vmaxps_avx(auVar24,ZEXT816(0) << 0x20);
                auVar50._0_4_ = auVar50._0_4_ + auVar23._0_4_;
                auVar50._4_4_ = fVar41 + auVar23._4_4_;
                auVar50._8_4_ = fVar44 + auVar23._8_4_;
                auVar50._12_4_ = fVar46 + auVar23._12_4_;
                auVar26._0_4_ = auVar26._0_4_ + auVar23._0_4_;
                auVar26._4_4_ = fVar28 + auVar23._4_4_;
                auVar26._8_4_ = fVar29 + auVar23._8_4_;
                auVar26._12_4_ = fVar30 + auVar23._12_4_;
                auVar33._0_4_ = auVar33._0_4_ + auVar24._0_4_;
                auVar33._4_4_ = fVar34 + auVar24._4_4_;
                auVar33._8_4_ = fVar35 + auVar24._8_4_;
                auVar33._12_4_ = fVar36 + auVar24._12_4_;
                auVar25._0_4_ = auVar25._0_4_ + auVar24._0_4_;
                auVar25._4_4_ = fVar38 + auVar24._4_4_;
                auVar25._8_4_ = fVar39 + auVar24._8_4_;
                auVar25._12_4_ = fVar40 + auVar24._12_4_;
                uVar9 = uVar9 + 1;
                psVar13 = psVar13 + 7;
              } while (uVar4 != uVar9);
            }
          }
        }
        sVar18 = k;
        if (bVar6) {
          auVar24 = vminps_avx(auVar50,auVar26);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar24,ZEXT416(geomID),0x30);
          auVar25 = vmaxps_avx(auVar33,auVar25);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416((uint)uVar11),0x30);
          local_88 = vminps_avx(local_88,(undefined1  [16])aVar7);
          local_98 = vmaxps_avx(local_98,(undefined1  [16])aVar8);
          auVar37._0_4_ = aVar7.x + aVar8.x;
          auVar37._4_4_ = aVar7.y + aVar8.y;
          auVar37._8_4_ = aVar7.z + aVar8.z;
          auVar37._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
          local_a8 = vminps_avx(local_a8,auVar37);
          local_b8 = vmaxps_avx(local_b8,auVar37);
          local_c0 = local_c0 + 1;
          sVar18 = k + 1;
          prims[k].lower.field_0.field_1 = aVar7;
          prims[k].upper.field_0.field_1 = aVar8;
        }
        uVar11 = uVar11 + 1;
        k = sVar18;
      } while (uVar11 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_88._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_88._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_98._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_98._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_b8._8_8_;
    __return_storage_ptr__->end = local_c0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }